

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

Var Js::JavascriptBigInt::Negate(Var aRight)

{
  JavascriptBigInt *pJVar1;
  
  pJVar1 = VarTo<Js::JavascriptBigInt>(aRight);
  pJVar1 = New(pJVar1,(((((pJVar1->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr);
  if ((pJVar1->m_length != 1) || (*(pJVar1->m_digits).ptr != 0)) {
    pJVar1->m_isNegative = (Type)(pJVar1->m_isNegative ^ 1);
  }
  return pJVar1;
}

Assistant:

Var JavascriptBigInt::Negate(Var aRight)
    {
        JavascriptBigInt* rightBigInt = VarTo<JavascriptBigInt>(aRight);
        JavascriptBigInt* newBigInt = JavascriptBigInt::New(rightBigInt, rightBigInt->GetScriptContext());
        JavascriptBigInt::Negate(newBigInt);
        return newBigInt;
    }